

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void EmitFileEntry(raw_ostream *OS,File *File)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_t in_RCX;
  void *__buf;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *__buf_00;
  uint64_t uVar4;
  
  llvm::raw_ostream::write(OS,(int)(File->Name).Data,(void *)(File->Name).Length,in_RCX);
  llvm::raw_ostream::write(OS,0,__buf,in_RCX);
  __buf_00 = extraout_RDX;
  uVar4 = File->DirIdx;
  do {
    uVar3 = (uint)(byte)((byte)uVar4 | 0x80);
    if (uVar4 < 0x80) {
      uVar3 = (uint)uVar4;
    }
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      __buf_00 = pcVar1 + 1;
      OS->OutBufCur = __buf_00;
      *pcVar1 = (char)uVar3;
    }
    else {
      llvm::raw_ostream::write(OS,uVar3 & 0xff,__buf_00,(size_t)pcVar1);
      __buf_00 = extraout_RDX_00;
    }
    bVar2 = 0x7f < uVar4;
    uVar4 = uVar4 >> 7;
  } while (bVar2);
  uVar4 = File->ModTime;
  do {
    uVar3 = (uint)(byte)((byte)uVar4 | 0x80);
    if (uVar4 < 0x80) {
      uVar3 = (uint)uVar4;
    }
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      __buf_00 = pcVar1 + 1;
      OS->OutBufCur = __buf_00;
      *pcVar1 = (char)uVar3;
    }
    else {
      llvm::raw_ostream::write(OS,uVar3 & 0xff,__buf_00,(size_t)pcVar1);
      __buf_00 = extraout_RDX_01;
    }
    bVar2 = 0x7f < uVar4;
    uVar4 = uVar4 >> 7;
  } while (bVar2);
  uVar4 = File->Length;
  do {
    uVar3 = (uint)(byte)((byte)uVar4 | 0x80);
    if (uVar4 < 0x80) {
      uVar3 = (uint)uVar4;
    }
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      __buf_00 = pcVar1 + 1;
      OS->OutBufCur = __buf_00;
      *pcVar1 = (char)uVar3;
    }
    else {
      llvm::raw_ostream::write(OS,uVar3 & 0xff,__buf_00,(size_t)pcVar1);
      __buf_00 = extraout_RDX_02;
    }
    bVar2 = 0x7f < uVar4;
    uVar4 = uVar4 >> 7;
  } while (bVar2);
  return;
}

Assistant:

static void EmitFileEntry(raw_ostream &OS, const DWARFYAML::File &File) {
  OS.write(File.Name.data(), File.Name.size());
  OS.write('\0');
  encodeULEB128(File.DirIdx, OS);
  encodeULEB128(File.ModTime, OS);
  encodeULEB128(File.Length, OS);
}